

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O1

void __thiscall QPDFWriter::preserveObjectStreams(QPDFWriter *this)

{
  _Rb_tree_header *p_Var1;
  element_type *peVar2;
  long lVar3;
  int iVar4;
  map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
  *pmVar5;
  Object *pOVar6;
  _Rb_tree_node_base *p_Var7;
  ulong uVar8;
  ulong uVar9;
  const_iterator iter;
  vector<bool,_std::allocator<bool>_> eligible;
  vector<bool,_std::allocator<bool>_> local_58;
  
  pmVar5 = QPDF::getXRefTableInternal
                     (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->pdf);
  p_Var1 = &(pmVar5->_M_t)._M_impl.super__Rb_tree_header;
  peVar2 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (peVar2->obj).streams_empty = true;
  p_Var7 = (pmVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  if (peVar2->preserve_unreferenced_objects == true) {
    for (; (_Rb_tree_header *)p_Var7 != p_Var1;
        p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
      iVar4 = QPDFXRefEntry::getType((QPDFXRefEntry *)&p_Var7[1]._M_parent);
      if (iVar4 == 2) {
        (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->obj
        ).streams_empty = false;
        iVar4 = QPDFXRefEntry::getObjStreamNumber((QPDFXRefEntry *)&p_Var7[1]._M_parent);
        peVar2 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        uVar9 = (ulong)(int)p_Var7[1]._M_color;
        lVar3 = *(long *)&(peVar2->obj).super_ObjTable<QPDFWriter::Object>.
                          super_vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>.
                          super__Vector_base<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>
                          ._M_impl;
        uVar8 = ((long)*(pointer *)
                        ((long)&(peVar2->obj).super_ObjTable<QPDFWriter::Object>.
                                super_vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>
                                .
                                super__Vector_base<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>
                        + 8) - lVar3 >> 2) * -0x5555555555555555;
        if (uVar8 < uVar9 || uVar8 - uVar9 == 0) {
          pOVar6 = ObjTable<QPDFWriter::Object>::large_element
                             (&(peVar2->obj).super_ObjTable<QPDFWriter::Object>,uVar9);
        }
        else {
          pOVar6 = (Object *)(lVar3 + uVar9 * 0xc);
        }
        pOVar6->object_stream = iVar4;
      }
    }
  }
  else {
    for (; (_Rb_tree_header *)p_Var7 != p_Var1;
        p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
      iVar4 = QPDFXRefEntry::getType((QPDFXRefEntry *)&p_Var7[1]._M_parent);
      if (iVar4 == 2) {
        peVar2 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        (peVar2->obj).streams_empty = false;
        QPDF::getCompressibleObjSet(&local_58,peVar2->pdf);
        for (p_Var7 = (pmVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var7 != p_Var1;
            p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
          iVar4 = QPDFXRefEntry::getType((QPDFXRefEntry *)&p_Var7[1]._M_parent);
          if ((iVar4 == 2) &&
             (uVar8 = (ulong)(int)p_Var7[1]._M_color,
             uVar8 < (ulong)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                     ((long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                     (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8)) {
            uVar9 = uVar8 + 0x3f;
            if (-1 < (long)uVar8) {
              uVar9 = uVar8;
            }
            if ((local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                 [((long)uVar9 >> 6) +
                  ((ulong)((uVar8 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
                 (uVar8 & 0x3f) & 1) != 0) {
              iVar4 = QPDFXRefEntry::getObjStreamNumber((QPDFXRefEntry *)&p_Var7[1]._M_parent);
              peVar2 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr;
              uVar9 = (ulong)(int)p_Var7[1]._M_color;
              lVar3 = *(long *)&(peVar2->obj).super_ObjTable<QPDFWriter::Object>.
                                super_vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>
                                .
                                super__Vector_base<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>
                                ._M_impl;
              uVar8 = ((long)*(pointer *)
                              ((long)&(peVar2->obj).super_ObjTable<QPDFWriter::Object>.
                                      super_vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>
                                      .
                                      super__Vector_base<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>
                              + 8) - lVar3 >> 2) * -0x5555555555555555;
              if (uVar8 < uVar9 || uVar8 - uVar9 == 0) {
                pOVar6 = ObjTable<QPDFWriter::Object>::large_element
                                   (&(peVar2->obj).super_ObjTable<QPDFWriter::Object>,uVar9);
              }
              else {
                pOVar6 = (Object *)(lVar3 + uVar9 * 0xc);
              }
              pOVar6->object_stream = iVar4;
            }
          }
        }
        if (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p == (_Bit_type *)0x0) {
          return;
        }
        operator_delete(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                        (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage -
                        (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        return;
      }
    }
  }
  return;
}

Assistant:

void
QPDFWriter::preserveObjectStreams()
{
    auto const& xref = QPDF::Writer::getXRefTable(m->pdf);
    // Our object_to_object_stream map has to map ObjGen -> ObjGen since we may be generating object
    // streams out of old objects that have generation numbers greater than zero. However in an
    // existing PDF, all object stream objects and all objects in them must have generation 0
    // because the PDF spec does not provide any way to do otherwise. This code filters out objects
    // that are not allowed to be in object streams. In addition to removing objects that were
    // erroneously included in object streams in the source PDF, it also prevents unreferenced
    // objects from being included.
    auto end = xref.cend();
    m->obj.streams_empty = true;
    if (m->preserve_unreferenced_objects) {
        for (auto iter = xref.cbegin(); iter != end; ++iter) {
            if (iter->second.getType() == 2) {
                // Pdf contains object streams.
                QTC::TC("qpdf", "QPDFWriter preserve object streams preserve unreferenced");
                m->obj.streams_empty = false;
                m->obj[iter->first].object_stream = iter->second.getObjStreamNumber();
            }
        }
    } else {
        // Start by scanning for first compressed object in case we don't have any object streams to
        // process.
        for (auto iter = xref.cbegin(); iter != end; ++iter) {
            if (iter->second.getType() == 2) {
                // Pdf contains object streams.
                QTC::TC("qpdf", "QPDFWriter preserve object streams");
                m->obj.streams_empty = false;
                auto eligible = QPDF::Writer::getCompressibleObjSet(m->pdf);
                // The object pointed to by iter may be a previous generation, in which case it is
                // removed by getCompressibleObjSet. We need to restart the loop (while the object
                // table may contain multiple generations of an object).
                for (iter = xref.cbegin(); iter != end; ++iter) {
                    if (iter->second.getType() == 2) {
                        auto id = static_cast<size_t>(iter->first.getObj());
                        if (id < eligible.size() && eligible[id]) {
                            m->obj[iter->first].object_stream = iter->second.getObjStreamNumber();
                        } else {
                            QTC::TC("qpdf", "QPDFWriter exclude from object stream");
                        }
                    }
                }
                return;
            }
        }
    }
}